

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int execute_filter_e8(rar_filter *filter,rar_virtual_machine *vm,size_t pos,int e9also)

{
  uint uVar1;
  byte bVar2;
  uint32_t uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  
  uVar3 = filter->initialregisters[4];
  iVar8 = 0;
  if (0xfffc4002 < uVar3 - 0x3c001) {
    uVar5 = 0;
    do {
      if ((vm->memory[uVar5] == 0xe8) || (e9also != 0 && vm->memory[uVar5] == 0xe9)) {
        uVar1 = (int)pos + 1 + uVar5;
        uVar6 = (ulong)(uVar5 + 1);
        bVar2 = vm->memory[uVar6 + 3];
        bVar4 = vm->memory[uVar6 + 2];
        uVar7 = (uint)bVar4 << 0x10 | (uint)vm->memory[uVar6] | (uint)vm->memory[uVar6 + 1] << 8 |
                (uint)bVar2 << 0x18;
        if (((int)((uint)bVar2 << 0x18) < 0) && (-uVar7 <= uVar1)) {
          iVar8 = uVar7 + 0x1000000;
          vm->memory[uVar6] = vm->memory[uVar6];
          vm->memory[uVar6 + 1] = vm->memory[uVar6 + 1];
LAB_00153150:
          vm->memory[uVar6 + 2] = bVar4;
          vm->memory[uVar6 + 3] = (uint8_t)((uint)iVar8 >> 0x18);
        }
        else if (bVar2 == 0) {
          iVar8 = uVar7 - uVar1;
          *(short *)(vm->memory + uVar6) = (short)iVar8;
          bVar4 = (byte)((uint)iVar8 >> 0x10);
          goto LAB_00153150;
        }
        uVar5 = uVar5 + 4;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 <= uVar3 - 5);
    filter->filteredblockaddress = 0;
    filter->filteredblocklength = uVar3;
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

static int
execute_filter_e8(struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos, int e9also)
{
  uint32_t length = filter->initialregisters[4];
  uint32_t filesize = 0x1000000;
  uint32_t i;

  if (length > PROGRAM_WORK_SIZE || length < 4)
    return 0;

  for (i = 0; i <= length - 5; i++)
  {
    if (vm->memory[i] == 0xE8 || (e9also && vm->memory[i] == 0xE9))
    {
      uint32_t currpos = (uint32_t)pos + i + 1;
      int32_t address = (int32_t)vm_read_32(vm, i + 1);
      if (address < 0 && currpos >= (uint32_t)-address)
        vm_write_32(vm, i + 1, address + filesize);
      else if (address >= 0 && (uint32_t)address < filesize)
        vm_write_32(vm, i + 1, address - currpos);
      i += 4;
    }
  }

  filter->filteredblockaddress = 0;
  filter->filteredblocklength = length;

  return 1;
}